

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O0

void __thiscall smf::MidiFile::clearLinks(MidiFile *this)

{
  int iVar1;
  reference ppMVar2;
  int local_14;
  int i;
  MidiFile *this_local;
  
  for (local_14 = 0; iVar1 = getTrackCount(this), local_14 < iVar1; local_14 = local_14 + 1) {
    ppMVar2 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::operator[]
                        (&this->m_events,(long)local_14);
    if (*ppMVar2 != (value_type)0x0) {
      ppMVar2 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::operator[]
                          (&this->m_events,(long)local_14);
      MidiEventList::clearLinks(*ppMVar2);
    }
  }
  this->m_linkedEventsQ = false;
  return;
}

Assistant:

void MidiFile::clearLinks(void) {
	for (int i=0; i<getTrackCount(); i++) {
		if (m_events[i] == NULL) {
			continue;
		}
		m_events[i]->clearLinks();
	}
	m_linkedEventsQ = false;
}